

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall QIconModeViewBase::filterDropEvent(QIconModeViewBase *this,QDropEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QListView *pQVar4;
  const_iterator o;
  QModelIndex *this_00;
  QWidget *pQVar5;
  QPoint __addr_len;
  sockaddr *__addr;
  QEvent *in_RSI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index_1;
  QList<QModelIndex> *__range1;
  QModelIndex *index;
  QList<QModelIndex> *__range2;
  QList<QModelIndex> *dropIndices;
  QPoint dest;
  QRect rect;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QModelIndex> indexes;
  QPoint delta;
  QPoint start;
  const_iterator __end2;
  const_iterator __begin2;
  ItemFlags dropableFlags;
  QPoint end;
  QPoint offset;
  QSize contents;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  enum_type in_stack_fffffffffffffe70;
  enum_type in_stack_fffffffffffffe74;
  QListViewPrivate *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QPoint *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 **ppuVar6;
  undefined4 in_stack_fffffffffffffeb0;
  QFlagsStorage<Qt::ItemFlag> in_stack_fffffffffffffeb4;
  byte local_119;
  const_iterator local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  QPoint local_b4;
  QPoint local_ac;
  QPoint local_a4;
  QPoint local_9c;
  Int local_94;
  Int local_90;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_8c;
  QModelIndex *local_88;
  const_iterator local_80;
  const_iterator local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [28];
  QFlagsStorage<Qt::ItemFlag> local_3c;
  QPointF local_38;
  QPoint local_28;
  QPoint local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QListView *)QDropEvent::source();
  if (pQVar4 != *(QListView **)
                 &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  super_QFramePrivate.super_QWidgetPrivate.field_0x10) {
    local_119 = 0;
    goto LAB_0088574d;
  }
  local_10 = *(QSize *)&(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        super_QFramePrivate.super_QWidgetPrivate.field_0x18;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = (*(*(_func_int ***)
              &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate)[0xd])();
  (*(*(_func_int ***)
      &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate
       .super_QWidgetPrivate)[0xe])();
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe78);
  local_28 = QPointF::toPoint((QPointF *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_20 = ::operator+((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (QPoint *)in_stack_fffffffffffffe78);
  bVar1 = QWidget::acceptDrops((QWidget *)0x885154);
  if (bVar1) {
    local_3c.i = 0xaaaaaaaa;
    local_3c.i = (Int)Qt::operator|(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
                 (QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*(*(_func_int ***)
        &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
         super_QFramePrivate.super_QWidgetPrivate)[7])(local_58,in_RDI,local_68);
    local_78[0].i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_78[0] = QList<QModelIndex>::begin
                            ((QList<QModelIndex> *)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_80.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_80 = QList<QModelIndex>::end
                         ((QList<QModelIndex> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    while( true ) {
      local_88 = local_80.i;
      bVar1 = QList<QModelIndex>::const_iterator::operator!=(local_78,local_80);
      if (!bVar1) break;
      QList<QModelIndex>::const_iterator::operator*(local_78);
      local_8c.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QModelIndex::flags((QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      local_90 = local_3c.i;
      in_stack_fffffffffffffeb4.i =
           (Int)QFlags<Qt::ItemFlag>::operator&
                          ((QFlags<Qt::ItemFlag> *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           (QFlagsStorageHelper<Qt::ItemFlag,_4>)SUB84(in_stack_fffffffffffffe78,0))
      ;
      local_94 = local_3c.i;
      bVar1 = ::operator==((QFlags<Qt::ItemFlag>)in_stack_fffffffffffffeb4.i,
                           (QFlags<Qt::ItemFlag>)local_3c.i);
      if (bVar1) {
        local_119 = 0;
        iVar3 = 1;
        goto LAB_00885318;
      }
      QList<QModelIndex>::const_iterator::operator++(local_78);
    }
    iVar3 = 0;
LAB_00885318:
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x885325);
    if (iVar3 != 0) goto LAB_0088574d;
    in_stack_fffffffffffffeb0 = 0;
  }
  local_9c = ((*(QListViewPrivate **)
                &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.field_0x8)->super_QAbstractItemViewPrivate
             ).pressedPosition;
  local_a4 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  if ((*(QListViewPrivate **)
        &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
         super_QFramePrivate.super_QWidgetPrivate.field_0x8)->movement == Snap) {
    local_ac = snapToGrid((QIconModeViewBase *)CONCAT44(iVar2,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88);
    local_b4 = snapToGrid((QIconModeViewBase *)CONCAT44(iVar2,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88);
    local_a4 = ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (QPoint *)in_stack_fffffffffffffe78);
  }
  else {
    local_a4 = ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (QPoint *)in_stack_fffffffffffffe78);
  }
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  __addr_len = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x88542b);
  QItemSelectionModel::selectedIndexes();
  ppuVar6 = &local_d0;
  local_d8.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QList<QModelIndex>::begin
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  o = QList<QModelIndex>::end
                ((QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                );
  while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_d8,o), bVar1) {
    this_00 = QList<QModelIndex>::const_iterator::operator*(&local_d8);
    QListViewPrivate::rectForIndex
              ((QListViewPrivate *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QModelIndex *)in_stack_fffffffffffffe78);
    pQVar5 = QCommonListViewBase::viewport((QCommonListViewBase *)in_RDI);
    QListViewPrivate::mapToViewport
              (in_RDI,(QRect *)CONCAT44(iVar2,in_stack_fffffffffffffe90),
               SUB81((ulong)pQVar5 >> 0x38,0));
    QWidget::update((QWidget *)in_stack_fffffffffffffe78,
                    (QRect *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    __addr_len = ::operator+((QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                             ,(QPoint *)in_stack_fffffffffffffe78);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8855ca);
    if (bVar1) {
      in_stack_fffffffffffffe78 =
           *(QListViewPrivate **)
            &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
      QPoint::x((QPoint *)0x8855eb);
      in_stack_fffffffffffffe84 =
           QListViewPrivate::flipX(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe6c);
    }
    QModelIndex::row(this_00);
    moveItem((QIconModeViewBase *)CONCAT44(in_stack_fffffffffffffeb4.i,in_stack_fffffffffffffeb0),
             (int)((ulong)ppuVar6 >> 0x20),(QPoint *)this_00);
    QAbstractItemView::update
              ((QAbstractItemView *)in_stack_fffffffffffffe78,
               (QModelIndex *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    QList<QModelIndex>::const_iterator::operator++(&local_d8);
  }
  QAbstractItemViewPrivate::stopAutoScroll
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  QList<QModelIndex>::clear
            ((QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  iVar2 = (int)&local_d0;
  QListViewPrivate::emitIndexesMoved
            ((QListViewPrivate *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (QModelIndexList *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  ((*(QListViewPrivate **)
     &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
      super_QWidgetPrivate.field_0x8)->super_QAbstractItemViewPrivate).dropEventMoved = true;
  QEvent::accept(in_RSI,iVar2,__addr,(socklen_t *)__addr_len);
  bVar1 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       (QSize *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (bVar1) {
    iVar2 = QSize::width((QSize *)0x8856d7);
    iVar3 = QSize::width((QSize *)0x8856e8);
    if (iVar3 < iVar2) {
      iVar2 = QSize::height((QSize *)0x885700);
      iVar3 = QSize::height((QSize *)0x885711);
      if (iVar2 <= iVar3) goto LAB_0088571b;
    }
    else {
LAB_0088571b:
      updateContentsSize((QIconModeViewBase *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    QListViewPrivate::viewUpdateGeometries((QListViewPrivate *)0x885733);
  }
  local_119 = 1;
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x88574d);
LAB_0088574d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_119 & 1);
}

Assistant:

bool QIconModeViewBase::filterDropEvent(QDropEvent *e)
{
    if (e->source() != qq)
        return false;

    const QSize contents = contentsSize;
    QPoint offset(horizontalOffset(), verticalOffset());
    QPoint end = e->position().toPoint() + offset;
    if (qq->acceptDrops()) {
        const Qt::ItemFlags dropableFlags = Qt::ItemIsDropEnabled|Qt::ItemIsEnabled;
        const QList<QModelIndex> &dropIndices = intersectingSet(QRect(end, QSize(1, 1)));
        for (const QModelIndex &index : dropIndices)
            if ((index.flags() & dropableFlags) == dropableFlags)
                return false;
    }
    QPoint start = dd->pressedPosition;
    QPoint delta = (dd->movement == QListView::Snap ? snapToGrid(end) - snapToGrid(start) : end - start);
    const QList<QModelIndex> indexes = dd->selectionModel->selectedIndexes();
    for (const auto &index : indexes) {
        QRect rect = dd->rectForIndex(index);
        viewport()->update(dd->mapToViewport(rect, false));
        QPoint dest = rect.topLeft() + delta;
        if (qq->isRightToLeft())
            dest.setX(dd->flipX(dest.x()) - rect.width());
        moveItem(index.row(), dest);
        qq->update(index);
    }
    dd->stopAutoScroll();
    draggedItems.clear();
    dd->emitIndexesMoved(indexes);
    // do not delete item on internal move, see filterStartDrag()
    dd->dropEventMoved = true;
    e->accept(); // we have handled the event
    // if the size has not grown, we need to check if it has shrunk
    if (contentsSize != contents) {
        if ((contentsSize.width() <= contents.width()
            || contentsSize.height() <= contents.height())) {
                updateContentsSize();
        }
        dd->viewUpdateGeometries();
    }
    return true;
}